

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  string *psVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar3;
  anon_enum_32 local_24;
  anon_enum_32 local_20 [4];
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x33f,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_20,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  local_20[0] = pEVar1->is_repeated ^ OPTIONAL_FIELD;
  local_24 = REPEATED_FIELD;
  psVar2 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                     (local_20,&local_24,
                      "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                     );
  if (psVar2 == (string *)0x0) {
    local_20[0] = anon_unknown_58::cpp_type(pEVar1->type);
    local_24 = 10;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_20,&local_24,
                        "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (psVar2 == (string *)0x0) {
      pVVar3 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                         ((RepeatedPtrFieldBase *)pEVar1->field_0,index);
      return pVVar3;
    }
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,0x340,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

MessageLite* ExtensionSet::MutableRepeatedMessage(int number, int index) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  return extension->ptr.repeated_message_value->Mutable(index);
}